

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# volid_test.cpp
# Opt level: O1

void generate_reference_file
               (string *idfileLocation,IDENTIFICATION_STRATEGY *strategies,int num_strategies)

{
  char cVar1;
  FUNCTION_RETURN FVar2;
  size_t sVar3;
  long lVar4;
  PcSignature identifier_out;
  ofstream idfile;
  char acStack_238 [24];
  long local_220;
  filebuf local_218 [240];
  ios_base local_128 [264];
  
  std::ofstream::ofstream((ostream *)&local_220,(string *)idfileLocation,_S_out);
  lVar4 = 0;
  do {
    FVar2 = generate_user_pc_signature(acStack_238,strategies[lVar4]);
    if (FVar2 != FUNC_RET_OK) {
      __assert_fail("generate_ok == FUNC_RET_OK",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/abernste[P]open-license-manager/test/functional/volid_test.cpp"
                    ,0x35,
                    "void generate_reference_file(const string &, IDENTIFICATION_STRATEGY *, int)");
    }
    sVar3 = strlen(acStack_238);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_220,acStack_238,sVar3);
    cVar1 = (char)(ostream *)&local_220;
    std::ios::widen((char)*(undefined8 *)(local_220 + -0x18) + cVar1);
    std::ostream::put(cVar1);
    std::ostream::flush();
    lVar4 = lVar4 + 1;
  } while (lVar4 != 4);
  std::ofstream::close();
  local_220 = 0;
  *(undefined8 *)(local_218 + lRamffffffffffffffe8 + -8) = 0;
  std::filebuf::~filebuf(local_218);
  std::ios_base::~ios_base(local_128);
  return;
}

Assistant:

static void generate_reference_file(const string& idfileLocation,
		IDENTIFICATION_STRATEGY strategies[], int num_strategies) {
	ofstream idfile(idfileLocation);
	PcSignature identifier_out;
	for (int i = 0; i < num_strategies; i++) {
		FUNCTION_RETURN generate_ok = generate_user_pc_signature(identifier_out,
				strategies[i]);
        BOOST_ASSERT(generate_ok == FUNC_RET_OK);
		if (generate_ok != FUNC_RET_OK){
			BOOST_ERROR("Generating identifier for strategy " << strategies[i] << " failed with: " << generate_ok);
            idfile << "0000-0000-0000-0000" << endl;
		}
        else
            idfile << identifier_out << endl;
	}
	idfile.close();
}